

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_select
                (run_container_t *container,uint32_t *start_rank,uint32_t rank,uint32_t *element)

{
  ushort uVar1;
  int local_34;
  uint16_t value;
  uint16_t length;
  int i;
  uint32_t *element_local;
  uint32_t rank_local;
  uint32_t *start_rank_local;
  run_container_t *container_local;
  
  local_34 = 0;
  while( true ) {
    if (container->n_runs <= local_34) {
      return false;
    }
    uVar1 = container->runs[local_34].length;
    if (rank <= *start_rank + (uint)uVar1) break;
    *start_rank = uVar1 + 1 + *start_rank;
    local_34 = local_34 + 1;
  }
  *element = (container->runs[local_34].value + rank) - *start_rank;
  return true;
}

Assistant:

bool run_container_select(const run_container_t *container,
                          uint32_t *start_rank, uint32_t rank,
                          uint32_t *element) {
    for (int i = 0; i < container->n_runs; i++) {
        uint16_t length = container->runs[i].length;
        if (rank <= *start_rank + length) {
            uint16_t value = container->runs[i].value;
            *element = value + rank - (*start_rank);
            return true;
        } else
            *start_rank += length + 1;
    }
    return false;
}